

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QMimeGlobPattern>::relocate
          (QArrayDataPointer<QMimeGlobPattern> *this,qsizetype offset,QMimeGlobPattern **data)

{
  bool bVar1;
  QMimeGlobPattern *first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  QMimeGlobPattern *res;
  
  first = (QMimeGlobPattern *)(*(long *)(in_RDI + 8) + in_RSI * 0x40);
  QtPrivate::q_relocate_overlap_n<QMimeGlobPattern,long_long>
            (first,in_RDI,(QMimeGlobPattern *)0x8f2bf7);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QMimeGlobPattern>,QMimeGlobPattern_const*>
                        (data,(QArrayDataPointer<QMimeGlobPattern> *)res), bVar1)) {
    *in_RDX = in_RSI * 0x40 + *in_RDX;
  }
  *(QMimeGlobPattern **)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }